

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_debug_getmetatable(jit_State *J,RecordFFData *rd)

{
  uint uVar1;
  int iVar2;
  short sVar3;
  ushort uVar4;
  undefined2 uVar5;
  TRef TVar6;
  long *in_RSI;
  long in_RDI;
  TRef tr;
  TRef mtref;
  GCtab *mt;
  TRef local_74;
  undefined2 in_stack_ffffffffffffff98;
  undefined2 in_stack_ffffffffffffff9a;
  IRType in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  IRType t;
  undefined4 in_stack_ffffffffffffffb4;
  
  uVar1 = **(uint **)(in_RDI + 0x88);
  if ((uVar1 & 0x1f000000) == 0xb000000) {
    iVar2 = *(int *)((ulong)*(uint *)*in_RSI + 0x10);
    *(undefined2 *)(in_RDI + 0xa4) = 0x440b;
    *(short *)(in_RDI + 0xa0) = (short)uVar1;
    *(undefined2 *)(in_RDI + 0xa2) = 5;
    local_74 = lj_opt_fold((jit_State *)
                           CONCAT44(in_stack_ffffffffffffff9c,
                                    CONCAT22(in_stack_ffffffffffffff9a,in_stack_ffffffffffffff98)));
  }
  else {
    if ((uVar1 & 0x1f000000) != 0xc000000) {
      if (*(uint *)(*in_RSI + 4) < 0xffff0000) {
        t = IRT_FLOAT;
      }
      else if (*(int *)(*in_RSI + 4) >> 0xf == -2) {
        t = IRT_LIGHTUD;
      }
      else {
        t = *(IRType *)(*in_RSI + 4) ^ ~IRT_NIL;
      }
      if (*(int *)(in_RDI + -0xb0 + (ulong)(t + IRT_U64) * 4) == 0) {
        TVar6 = 0x7fff;
      }
      else {
        TVar6 = lj_ir_kgc((jit_State *)CONCAT44(in_stack_ffffffffffffffb4,uVar1),
                          (GCobj *)(in_RDI + -0xb0),t);
      }
      **(TRef **)(in_RDI + 0x88) = TVar6;
      return;
    }
    iVar2 = *(int *)((ulong)*(uint *)*in_RSI + 0x10);
    *(undefined2 *)(in_RDI + 0xa4) = 0x440b;
    *(short *)(in_RDI + 0xa0) = (short)uVar1;
    *(undefined2 *)(in_RDI + 0xa2) = 0xb;
    local_74 = lj_opt_fold((jit_State *)
                           CONCAT44(in_stack_ffffffffffffff9c,
                                    CONCAT22(in_stack_ffffffffffffff9a,in_stack_ffffffffffffff98)));
  }
  sVar3 = 8;
  if (iVar2 != 0) {
    sVar3 = 9;
  }
  uVar4 = sVar3 << 8 | 0x8b;
  uVar5 = (undefined2)local_74;
  TVar6 = lj_ir_knull((jit_State *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff9c);
  *(ushort *)(in_RDI + 0xa4) = uVar4;
  *(undefined2 *)(in_RDI + 0xa0) = uVar5;
  *(short *)(in_RDI + 0xa2) = (short)TVar6;
  lj_opt_fold((jit_State *)CONCAT44(in_stack_ffffffffffffff9c,CONCAT22(uVar5,uVar4)));
  if (iVar2 == 0) {
    local_74 = 0x7fff;
  }
  **(TRef **)(in_RDI + 0x88) = local_74;
  return;
}

Assistant:

static void LJ_FASTCALL recff_debug_getmetatable(jit_State *J, RecordFFData *rd)
{
  GCtab *mt;
  TRef mtref;
  TRef tr = J->base[0];
  if (tref_istab(tr)) {
    mt = tabref(tabV(&rd->argv[0])->metatable);
    mtref = emitir(IRT(IR_FLOAD, IRT_TAB), tr, IRFL_TAB_META);
  } else if (tref_isudata(tr)) {
    mt = tabref(udataV(&rd->argv[0])->metatable);
    mtref = emitir(IRT(IR_FLOAD, IRT_TAB), tr, IRFL_UDATA_META);
  } else {
    mt = tabref(basemt_obj(J2G(J), &rd->argv[0]));
    J->base[0] = mt ? lj_ir_ktab(J, mt) : TREF_NIL;
    return;
  }
  emitir(IRTG(mt ? IR_NE : IR_EQ, IRT_TAB), mtref, lj_ir_knull(J, IRT_TAB));
  J->base[0] = mt ? mtref : TREF_NIL;
}